

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsst.cpp
# Opt level: O1

unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true> __thiscall
duckdb::FSSTStorage::StringInitScan(FSSTStorage *this,ColumnSegment *segment)

{
  uint uVar1;
  BlockManager *pBVar2;
  data_ptr_t pdVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  duckdb_fsst_decoder_t *decoder;
  element_type *peVar5;
  element_type *peVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  bool bVar8;
  u32 uVar9;
  uint32_t uVar10;
  BlockHandle *pBVar11;
  idx_t iVar12;
  idx_t iVar13;
  FSSTScanState *this_00;
  BufferManager *pBVar14;
  pointer pFVar15;
  fsst_compression_header_t *header_ptr;
  optional_ptr<duckdb::FileBuffer,_true> *this_01;
  templated_unique_single_t state;
  _Head_base<0UL,_duckdb::FSSTScanState_*,_false> local_50;
  BufferHandle local_48;
  
  pBVar11 = shared_ptr<duckdb::BlockHandle,_true>::operator->(&segment->block);
  pBVar2 = pBVar11->block_manager;
  iVar12 = optional_idx::GetIndex(&pBVar2->block_alloc_size);
  iVar13 = optional_idx::GetIndex(&pBVar2->block_header_size);
  iVar12 = iVar12 - iVar13 >> 2 & 0xfffffffffffffff8;
  if (0xfff < iVar12) {
    iVar12 = 0x1000;
  }
  this_00 = (FSSTScanState *)operator_new(0x88);
  FSSTScanState::FSSTScanState(this_00,iVar12);
  local_50._M_head_impl = this_00;
  pBVar14 = BufferManager::GetBufferManager(segment->db);
  (*pBVar14->_vptr_BufferManager[7])(&local_48,pBVar14,&segment->block);
  pFVar15 = unique_ptr<duckdb::FSSTScanState,_std::default_delete<duckdb::FSSTScanState>,_true>::
            operator->((unique_ptr<duckdb::FSSTScanState,_std::default_delete<duckdb::FSSTScanState>,_true>
                        *)&local_50);
  BufferHandle::operator=(&(pFVar15->super_StringScanState).handle,&local_48);
  BufferHandle::~BufferHandle(&local_48);
  pFVar15 = unique_ptr<duckdb::FSSTScanState,_std::default_delete<duckdb::FSSTScanState>,_true>::
            operator->((unique_ptr<duckdb::FSSTScanState,_std::default_delete<duckdb::FSSTScanState>,_true>
                        *)&local_50);
  this_01 = &(pFVar15->super_StringScanState).handle.node;
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(this_01);
  pdVar3 = this_01->ptr->buffer;
  iVar12 = segment->offset;
  make_buffer<duckdb_fsst_decoder_t>();
  pFVar15 = unique_ptr<duckdb::FSSTScanState,_std::default_delete<duckdb::FSSTScanState>,_true>::
            operator->((unique_ptr<duckdb::FSSTScanState,_std::default_delete<duckdb::FSSTScanState>,_true>
                        *)&local_50);
  _Var7._M_pi = local_48.handle.internal.
                super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
  peVar6 = local_48.handle.internal.
           super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_48.handle.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  local_48.handle.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var4 = (pFVar15->duckdb_fsst_decoder).internal.
           super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (pFVar15->duckdb_fsst_decoder).internal.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = peVar6;
  (pFVar15->duckdb_fsst_decoder).internal.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var7._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  if (local_48.handle.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.handle.internal.
               super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              );
  }
  pFVar15 = unique_ptr<duckdb::FSSTScanState,_std::default_delete<duckdb::FSSTScanState>,_true>::
            operator->((unique_ptr<duckdb::FSSTScanState,_std::default_delete<duckdb::FSSTScanState>,_true>
                        *)&local_50);
  decoder = (duckdb_fsst_decoder_t *)
            (pFVar15->duckdb_fsst_decoder).internal.
            super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pFVar15 = unique_ptr<duckdb::FSSTScanState,_std::default_delete<duckdb::FSSTScanState>,_true>::
            operator->((unique_ptr<duckdb::FSSTScanState,_std::default_delete<duckdb::FSSTScanState>,_true>
                        *)&local_50);
  uVar1 = *(uint *)(pdVar3 + iVar12 + 0xc);
  pFVar15->current_width = pdVar3[iVar12 + 8];
  uVar9 = duckdb_fsst_import(decoder,pdVar3 + uVar1 + iVar12);
  if (uVar9 == 0) {
    pFVar15 = unique_ptr<duckdb::FSSTScanState,_std::default_delete<duckdb::FSSTScanState>,_true>::
              operator->((unique_ptr<duckdb::FSSTScanState,_std::default_delete<duckdb::FSSTScanState>,_true>
                          *)&local_50);
    p_Var4 = (pFVar15->duckdb_fsst_decoder).internal.
             super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (pFVar15->duckdb_fsst_decoder).internal.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    (pFVar15->duckdb_fsst_decoder).internal.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
    }
  }
  pFVar15 = unique_ptr<duckdb::FSSTScanState,_std::default_delete<duckdb::FSSTScanState>,_true>::
            operator->((unique_ptr<duckdb::FSSTScanState,_std::default_delete<duckdb::FSSTScanState>,_true>
                        *)&local_50);
  peVar5 = (pFVar15->duckdb_fsst_decoder).internal.
           super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pFVar15 = unique_ptr<duckdb::FSSTScanState,_std::default_delete<duckdb::FSSTScanState>,_true>::
            operator->((unique_ptr<duckdb::FSSTScanState,_std::default_delete<duckdb::FSSTScanState>,_true>
                        *)&local_50);
  pFVar15->duckdb_fsst_decoder_ptr = peVar5;
  bVar8 = StringStats::HasMaxStringLength(&(segment->stats).statistics);
  if (bVar8) {
    uVar10 = StringStats::MaxStringLength(&(segment->stats).statistics);
    pFVar15 = unique_ptr<duckdb::FSSTScanState,_std::default_delete<duckdb::FSSTScanState>,_true>::
              operator->((unique_ptr<duckdb::FSSTScanState,_std::default_delete<duckdb::FSSTScanState>,_true>
                          *)&local_50);
    pFVar15->all_values_inlined = uVar10 < 0xd;
  }
  *(FSSTScanState **)this = local_50._M_head_impl;
  return (unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>_>)
         (unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>_>)this;
}

Assistant:

unique_ptr<SegmentScanState> FSSTStorage::StringInitScan(ColumnSegment &segment) {
	auto string_block_limit = StringUncompressed::GetStringBlockLimit(segment.GetBlockManager().GetBlockSize());
	auto state = make_uniq<FSSTScanState>(string_block_limit);
	auto &buffer_manager = BufferManager::GetBufferManager(segment.db);
	state->handle = buffer_manager.Pin(segment.block);
	auto base_ptr = state->handle.Ptr() + segment.GetBlockOffset();

	state->duckdb_fsst_decoder = make_buffer<duckdb_fsst_decoder_t>();
	auto retval = ParseFSSTSegmentHeader(
	    base_ptr, reinterpret_cast<duckdb_fsst_decoder_t *>(state->duckdb_fsst_decoder.get()), &state->current_width);
	if (!retval) {
		state->duckdb_fsst_decoder = nullptr;
	}
	state->duckdb_fsst_decoder_ptr = state->duckdb_fsst_decoder.get();

	if (StringStats::HasMaxStringLength(segment.stats.statistics)) {
		state->all_values_inlined = StringStats::MaxStringLength(segment.stats.statistics) <= string_t::INLINE_LENGTH;
	}

	return std::move(state);
}